

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# faup.c
# Opt level: O3

faup_handler_t * faup_init(faup_options_t *options)

{
  faup_handler_t *pfVar1;
  faup_options_t *pfVar2;
  
  pfVar1 = (faup_handler_t *)malloc(0xb8);
  if (pfVar1 == (faup_handler_t *)0x0) {
    faup_init_cold_1();
  }
  else {
    pfVar1->options_handled_externally = (uint)(options != (faup_options_t *)0x0);
    (pfVar1->faup).decoded = false;
    memset(&(pfVar1->faup).features,0,0x94);
    if (options == (faup_options_t *)0x0) {
      pfVar2 = faup_options_new();
      pfVar1->options = pfVar2;
    }
    else {
      pfVar1->options = options;
    }
  }
  return pfVar1;
}

Assistant:

faup_handler_t *faup_init(faup_options_t *options)
{
    faup_handler_t *fh;
    int retval;

    fh = malloc(sizeof(faup_handler_t));
    if (!fh) {
      fprintf(stderr, "Could not allocate a faup_handler_t\n");
      return NULL;
    }
    fh->options_handled_externally = options?1:0;
    fh->faup.decoded = false;
    fh->faup.url_type = FAUP_URL_HAS_NO_TLD;
    memset(&fh->faup.features, 0, sizeof(fh->faup.features));

    if (options) {
        fh->options = options;
    } else {
        fh->options = faup_options_new();
    }
#ifdef FAUP_LUA_MODULES
    retval = faup_modules_new(fh);
#endif

	return fh;
}